

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::WriteString(ON_BinaryArchive *this,ON_wString *s)

{
  ON__UINT32 sUTF32_count_00;
  wchar_t *sUTF32_00;
  int iVar1;
  unsigned_short *puVar2;
  ulong count;
  uint local_7c;
  int local_78;
  ON__UINT32 ui32_1;
  int sUTF16_count1;
  undefined1 local_68 [8];
  ON_SimpleArray<unsigned_short> utf16_buffer;
  uint local_48;
  int sUTF16_count;
  uint error_status;
  ON__UINT32 error_code_point;
  uint error_mask;
  int sUTF32_count;
  ON__UINT32 *sUTF32;
  ON__INT32 local_28;
  int bTestByteOrder;
  ON__UINT32 ui32;
  bool rc;
  size_t string_element_count;
  ON_wString *s_local;
  ON_BinaryArchive *this_local;
  
  string_element_count = (size_t)s;
  s_local = (ON_wString *)this;
  ON_wString::IsValid(s,false);
  iVar1 = ON_wString::Length((ON_wString *)string_element_count);
  _ui32 = (ulong)iVar1;
  if (_ui32 != 0) {
    _ui32 = _ui32 + 1;
  }
  bTestByteOrder._3_1_ = 0;
  if (_ui32 < 2) {
    local_28 = 0;
    bTestByteOrder._3_1_ = WriteInt32(this,1,&local_28);
  }
  else if (_ui32 != 0) {
    sUTF32._4_4_ = 0;
    _error_mask = ON_wString::Array((ON_wString *)string_element_count);
    error_code_point = (int)_ui32 - 1;
    error_status = 0xffffffff;
    sUTF16_count = 0xfffd;
    local_48 = 0;
    utf16_buffer.m_capacity =
         ON_ConvertUTF32ToUTF16
                   (0,(ON__UINT32 *)_error_mask,error_code_point,(ON__UINT16 *)0x0,0,&local_48,
                    0xffffffff,0xfffd,(ON__UINT32 **)0x0);
    if (0 < utf16_buffer.m_capacity) {
      local_48 = 0;
      ON_SimpleArray<unsigned_short>::ON_SimpleArray
                ((ON_SimpleArray<unsigned_short> *)local_68,(long)(utf16_buffer.m_capacity + 1));
      ON_SimpleArray<unsigned_short>::SetCount
                ((ON_SimpleArray<unsigned_short> *)local_68,utf16_buffer.m_capacity + 1);
      sUTF32_00 = _error_mask;
      sUTF32_count_00 = error_code_point;
      puVar2 = ON_SimpleArray<unsigned_short>::Array((ON_SimpleArray<unsigned_short> *)local_68);
      iVar1 = ON_SimpleArray<unsigned_short>::Count((ON_SimpleArray<unsigned_short> *)local_68);
      local_78 = ON_ConvertUTF32ToUTF16
                           (0,(ON__UINT32 *)sUTF32_00,sUTF32_count_00,puVar2,iVar1,&local_48,
                            0xffffffff,0xfffd,(ON__UINT32 **)0x0);
      if (local_78 == utf16_buffer.m_capacity) {
        puVar2 = ON_SimpleArray<unsigned_short>::operator[]
                           ((ON_SimpleArray<unsigned_short> *)local_68,utf16_buffer.m_capacity);
        *puVar2 = 0;
        local_7c = utf16_buffer.m_capacity + 1;
        bTestByteOrder._3_1_ = WriteInt32(this,1,(ON__INT32 *)&local_7c);
        if (((bool)bTestByteOrder._3_1_) && (local_7c != 0)) {
          count = (ulong)local_7c;
          puVar2 = ON_SimpleArray<unsigned_short>::Array((ON_SimpleArray<unsigned_short> *)local_68)
          ;
          bTestByteOrder._3_1_ = WriteInt16(this,count,(ON__INT16 *)puVar2);
        }
      }
      ON_SimpleArray<unsigned_short>::~ON_SimpleArray((ON_SimpleArray<unsigned_short> *)local_68);
    }
  }
  return (bool)(bTestByteOrder._3_1_ & 1);
}

Assistant:

bool
ON_BinaryArchive::WriteString( const ON_wString& s )
{
  // No matter what size wchar_t is, this function writes a UTF-16 encoded string
  // to the archive.
#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_PUSH
// Disable the MSC /W4 "conditional expression is constant" warning
// about 2 == sizeof(wchar_t).  Since this code has to run on machines
// where sizeof(wchar_t) can be 2, 4, or ... bytes, the test is necessary.
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4127 )
#endif

  // The ON_wString::IsValid call prevents corrupt strings from breaking file IO
  // The parameter MUST be false here.
  s.IsValid(false);

  // NOTE WELL:
  //   In some cases there are embedded nulls in strings.
  size_t string_element_count = s.Length();
  if ( string_element_count > 0)
    string_element_count++;
  bool rc = false;
  if ( string_element_count <= 1 )
  {
    ON__UINT32 ui32 = 0;
    rc = WriteInt32(1,(ON__INT32*)&ui32);
  }
  else if ( 2 == sizeof(wchar_t) && string_element_count > 0 ) 
  {
    ON__UINT32 ui32 = (ON__UINT32)string_element_count;
    rc = WriteInt32(1,(ON__INT32*)&ui32);
    if (rc)
      rc = WriteInt16( string_element_count, (const ON__INT16*)s.Array() );
  }
  else if ( 4 == sizeof(wchar_t) && string_element_count > 0 )
  {
    // Assume the string is UTF-32 encoded (this is the case for some gcc implementations).
    const int bTestByteOrder = false;
    const ON__UINT32* sUTF32 = (const ON__UINT32*)s.Array();
    const int sUTF32_count = (int)(string_element_count-1);
    const unsigned int error_mask = 0xFFFFFFFF;
    const ON__UINT32 error_code_point = 0xFFFD; 
    unsigned int error_status = 0;

    const int sUTF16_count = ON_ConvertUTF32ToUTF16(
      bTestByteOrder,
      sUTF32,
      sUTF32_count,
      0, // ON__UINT16* sUTF16,
      0, // int sUTF16_count,
      &error_status,
      error_mask,
      error_code_point,
      0 // const ON__UINT32** sNextUTF32
      );

    if ( sUTF16_count > 0 )
    {
      error_status = 0;
      ON_SimpleArray<ON__UINT16> utf16_buffer(sUTF16_count+1);
      utf16_buffer.SetCount(sUTF16_count+1);
      const int sUTF16_count1 = ON_ConvertUTF32ToUTF16(
        bTestByteOrder,
        sUTF32,
        sUTF32_count,
        utf16_buffer.Array(),
        utf16_buffer.Count(),
        &error_status,
        error_mask,
        error_code_point,
        0 // const ON__UINT32** sNextUTF32
        );
      if ( sUTF16_count1 == sUTF16_count )
      {
        utf16_buffer[sUTF16_count] = 0;
        const ON__UINT32 ui32 = (ON__UINT32)(sUTF16_count+1);
        rc = WriteInt32(1,(const ON__INT32*)&ui32);
        if ( rc && ui32 > 0 )
          rc = WriteInt16( ui32, (const ON__INT16*)utf16_buffer.Array() );
      }
    }
  }
  return rc;  

#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_POP
#endif
}